

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self,EVP_PKEY *key)

{
  st_ptls_openssl_signature_scheme_t *psVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int local_4;
  
  *in_RDI = sign_certificate;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  psVar1 = lookup_signature_schemes((EVP_PKEY *)0x0);
  in_RDI[2] = psVar1;
  if (psVar1 == (st_ptls_openssl_signature_scheme_t *)0x0) {
    local_4 = 0x204;
  }
  else {
    EVP_PKEY_up_ref(in_RSI);
    in_RDI[1] = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self, EVP_PKEY *key)
{
    *self = (ptls_openssl_sign_certificate_t){{sign_certificate}};

    if ((self->schemes = lookup_signature_schemes(key)) == NULL)
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    EVP_PKEY_up_ref(key);
    self->key = key;

    return 0;
}